

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_internal_V5_dimstyle.cpp
# Opt level: O1

bool __thiscall
ON_DimStyleExtra::DeleteAfterRead
          (ON_DimStyleExtra *this,ON_BinaryArchive *archive,ON_Object *parent_object)

{
  uint uVar1;
  bool *pbVar2;
  undefined8 uVar3;
  undefined1 uVar4;
  undefined2 uVar5;
  bool bVar6;
  ON_UUID *b;
  uint uVar7;
  ulong uVar8;
  ON_ModelComponent *this_00;
  
  if (parent_object == (ON_Object *)0x0) {
    this_00 = (ON_ModelComponent *)0x0;
  }
  else {
    bVar6 = ON_Object::IsKindOf(parent_object,&ON_V5x_DimStyle::m_ON_V5x_DimStyle_class_rtti);
    this_00 = (ON_ModelComponent *)0x0;
    if (bVar6) {
      this_00 = (ON_ModelComponent *)parent_object;
    }
  }
  if (this_00 != (ON_ModelComponent *)0x0) {
    b = ON_ModelComponent::ParentId(this_00);
    bVar6 = ::operator==(&ON_nil_uuid,b);
    if (bVar6) {
      ON_ModelComponent::SetParentId(this_00,&this->m_parent_dimstyle);
    }
    if (this_00[3].m_component_name_hash.m_flags == 0) {
      uVar1 = (this->m_valid_fields).m_count;
      uVar7 = 0x58;
      if (uVar1 < 0x58) {
        uVar7 = uVar1;
      }
      if ((ulong)uVar1 != 0) {
        pbVar2 = (this->m_valid_fields).m_a;
        uVar8 = 0;
        do {
          if (uVar8 < 2) {
            this_00[3].m_component_name_hash.m_sha1_hash.m_digest[uVar8] = '\0';
          }
          else {
            bVar6 = pbVar2[uVar8];
            this_00[3].m_component_name_hash.m_sha1_hash.m_digest[uVar8] = bVar6;
            if (bVar6 == true) {
              this_00[3].m_component_name_hash.m_flags =
                   this_00[3].m_component_name_hash.m_flags + 1;
            }
          }
          uVar8 = uVar8 + 1;
        } while (uVar7 != uVar8);
      }
      if (uVar1 < 0x58) {
        memset(this_00[3].m_component_name_hash.m_sha1_hash.m_digest + uVar1,0,
               (ulong)(0x57 - uVar7) + 1);
      }
    }
    uVar4 = *(undefined1 *)((long)&this->m_tolerance_style + 1);
    uVar5 = *(undefined2 *)((long)&this->m_tolerance_style + 2);
    this_00[4].m_component_type = *(undefined1 *)&this->m_tolerance_style;
    this_00[4].field_0x2d = uVar4;
    this_00[4].m_locked_status = uVar5;
    uVar5 = *(undefined2 *)((long)&this->m_tolerance_resolution + 2);
    this_00[4].m_set_status = *(undefined2 *)&this->m_tolerance_resolution;
    this_00[4].m_component_status.m_status_flags = (char)uVar5;
    this_00[4].m_component_status.m_mark_bits = (char)((ushort)uVar5 >> 8);
    *(double *)&this_00[4].m_component_index = this->m_tolerance_upper_value;
    *(double *)&this_00[4].m_component_id = this->m_tolerance_lower_value;
    *(double *)this_00[4].m_component_id.Data4 = this->m_tolerance_height_scale;
    this_00[4].m_component_parent_id.Data4[0] = this->m_bDrawMask;
    *(int *)(this_00[4].m_component_parent_id.Data4 + 4) = this->m_mask_color_source;
    this_00[4].m_component_name_hash.m_flags = (ON__UINT32)(this->m_mask_color).field_0;
    *(double *)(this_00[4].m_component_name_hash.m_sha1_hash.m_digest + 4) = this->m_dimscale;
    *(int *)(this_00[4].m_component_name_hash.m_sha1_hash.m_digest + 0xc) = this->m_dimscale_source;
    uVar3 = *(undefined8 *)(this->m_source_dimstyle).Data4;
    *(undefined8 *)(this_00[4].m_component_name_hash.m_sha1_hash.m_digest + 0x10) =
         *(undefined8 *)&this->m_source_dimstyle;
    this_00[4].m_component_name_hash.m_parent_id.Data2 = (short)uVar3;
    this_00[4].m_component_name_hash.m_parent_id.Data3 = (short)((ulong)uVar3 >> 0x10);
    this_00[4].m_component_name_hash.m_parent_id.Data4[0] = (char)((ulong)uVar3 >> 0x20);
    this_00[4].m_component_name_hash.m_parent_id.Data4[1] = (char)((ulong)uVar3 >> 0x28);
    this_00[4].m_component_name_hash.m_parent_id.Data4[2] = (char)((ulong)uVar3 >> 0x30);
    this_00[4].m_component_name_hash.m_parent_id.Data4[3] = (char)((ulong)uVar3 >> 0x38);
  }
  return true;
}

Assistant:

bool ON_DimStyleExtra::DeleteAfterRead(
  const class ON_BinaryArchive& archive,
  class ON_Object* parent_object
) const
{
  // Move settings to ON_V5x_DimStyle
  for (;;)
  {
    ON_V5x_DimStyle* dimstyle = ON_V5x_DimStyle::Cast(parent_object);
    if (nullptr == dimstyle)
      break;

    if (ON_nil_uuid == dimstyle->ParentId())
      dimstyle->SetParentId(this->m_parent_dimstyle);

    if (0 == dimstyle->m_field_override_count)
    {
      const unsigned int capacity = sizeof(dimstyle->m_field_override) / sizeof(dimstyle->m_field_override[0]);
      unsigned int count = m_valid_fields.Count();
      if ( count > static_cast<unsigned int>(ON_V5x_DimStyle::Field::FieldCount) )
        count = static_cast<unsigned int>(ON_V5x_DimStyle::Field::FieldCount);
      for (unsigned int i = 0; i < count && i < capacity; i++)
      {
        bool bOverrideParentSetting 
          = (i > static_cast<unsigned int>(ON_V5x_DimStyle::Field::fn_index) && i <= static_cast<unsigned int>(ON_V5x_DimStyle::Field::fn_dim_arrow_blockname2) && this->m_valid_fields[i])
          ? true 
          : false;
        dimstyle->m_field_override[i] = bOverrideParentSetting;
        if (bOverrideParentSetting)
          dimstyle->m_field_override_count++;
      }
      for (unsigned int i = count; i < capacity; i++)
        dimstyle->m_field_override[i] = false;
    }
    dimstyle->m_tolerance_style = this->m_tolerance_style;
    dimstyle->m_tolerance_resolution = this->m_tolerance_resolution;
    dimstyle->m_tolerance_upper_value = this->m_tolerance_upper_value;
    dimstyle->m_tolerance_lower_value = this->m_tolerance_lower_value;
    dimstyle->m_tolerance_height_scale = this->m_tolerance_height_scale;
    dimstyle->m_bDrawMask = this->m_bDrawMask;
    dimstyle->m_mask_color_source = this->m_mask_color_source;
    dimstyle->m_mask_color = this->m_mask_color;
    dimstyle->m_dimscale = this->m_dimscale;
    dimstyle->m_dimscale_source = this->m_dimscale_source;
    dimstyle->m_source_dimstyle = this->m_source_dimstyle;
   
    break;
  }

  return true;
}